

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O3

HighsInt Highs_setSolution(void *highs,double *col_value,double *row_value,double *col_dual,
                          double *row_dual)

{
  HighsStatus HVar1;
  size_type sVar2;
  size_type sVar3;
  HighsSolution solution;
  HighsSolution local_98;
  
  local_98.value_valid = false;
  local_98.dual_valid = false;
  local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar3 = (size_type)*(int *)((long)highs + 0x138);
  if (0 < (long)sVar3) {
    if (col_value != (double *)0x0) {
      std::vector<double,_std::allocator<double>_>::resize(&local_98.col_value,sVar3);
      sVar2 = 0;
      do {
        local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[sVar2] = col_value[sVar2];
        sVar2 = sVar2 + 1;
      } while (sVar3 != sVar2);
    }
    if (col_dual != (double *)0x0) {
      std::vector<double,_std::allocator<double>_>::resize(&local_98.col_dual,sVar3);
      sVar2 = 0;
      do {
        local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[sVar2] = col_dual[sVar2];
        sVar2 = sVar2 + 1;
      } while (sVar3 != sVar2);
    }
  }
  sVar3 = (size_type)*(int *)((long)highs + 0x13c);
  if (0 < (long)sVar3) {
    if (row_value != (double *)0x0) {
      std::vector<double,_std::allocator<double>_>::resize(&local_98.row_value,sVar3);
      sVar2 = 0;
      do {
        local_98.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[sVar2] = row_value[sVar2];
        sVar2 = sVar2 + 1;
      } while (sVar3 != sVar2);
    }
    if (row_dual != (double *)0x0) {
      std::vector<double,_std::allocator<double>_>::resize(&local_98.row_dual,sVar3);
      sVar2 = 0;
      do {
        local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[sVar2] = row_dual[sVar2];
        sVar2 = sVar2 + 1;
      } while (sVar3 != sVar2);
    }
  }
  HVar1 = Highs::setSolution((Highs *)highs,&local_98);
  if (local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar1;
}

Assistant:

HighsInt Highs_setSolution(void* highs, const double* col_value,
                           const double* row_value, const double* col_dual,
                           const double* row_dual) {
  HighsSolution solution;
  const HighsInt num__col = Highs_getNumCol(highs);
  if (num__col > 0) {
    if (col_value) {
      solution.col_value.resize(num__col);
      for (HighsInt i = 0; i < num__col; i++)
        solution.col_value[i] = col_value[i];
    }
    if (col_dual) {
      solution.col_dual.resize(num__col);
      for (HighsInt i = 0; i < num__col; i++)
        solution.col_dual[i] = col_dual[i];
    }
  }
  const HighsInt num__row = Highs_getNumRow(highs);
  if (num__row > 0) {
    if (row_value) {
      solution.row_value.resize(num__row);
      for (HighsInt i = 0; i < num__row; i++)
        solution.row_value[i] = row_value[i];
    }
    if (row_dual) {
      solution.row_dual.resize(num__row);
      for (HighsInt i = 0; i < num__row; i++)
        solution.row_dual[i] = row_dual[i];
    }
  }

  return (HighsInt)((Highs*)highs)->setSolution(solution);
}